

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O0

void __thiscall wasm::Options::parse(Options *this,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  __type_conflict _Var2;
  unsigned_long uVar3;
  reference __lhs;
  ostream *poVar4;
  long lVar5;
  Option *o;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_> *__range2;
  Option *option;
  string local_c8 [32];
  long local_a8;
  size_type equal;
  string argument;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string currentOption;
  size_t e;
  size_t i;
  long lStack_30;
  anon_class_1_0_00000001 dashes;
  size_t positionalsSeen;
  char **argList;
  char **argv_local;
  int argc_local;
  Options *this_local;
  
  if (argc < 1) {
    __assert_fail("argc > 0 && \"expect at least program name as an argument\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp"
                  ,0xc0,"void wasm::Options::parse(int, const char **)");
  }
  lStack_30 = 0;
  e = 1;
  currentOption.field_2._8_8_ = SEXT48(argc);
  do {
    if (e == currentOption.field_2._8_8_) {
      return;
    }
    __s = argv[e];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_69);
    std::allocator<char>::~allocator(&local_69);
    uVar3 = parse::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 7),(string *)local_68);
    if ((uVar3 == 0) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"-"), bVar1)) {
      switch(this->positional) {
      case Zero:
      case Optional:
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unexpected positional argument \'");
        poVar4 = std::operator<<(poVar4,(string *)local_68);
        std::operator<<(poVar4,"\'\n");
        exit(1);
      case One:
        if (lStack_30 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Unexpected second positional argument \'")
          ;
          poVar4 = std::operator<<(poVar4,(string *)local_68);
          poVar4 = std::operator<<(poVar4,"\' for ");
          poVar4 = std::operator<<(poVar4,(string *)&this->positionalName);
          std::operator<<(poVar4,'\n');
          exit(1);
        }
      case N:
        std::
        function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&this->positionalAction,this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
        lStack_30 = lStack_30 + 1;
      default:
        argument.field_2._8_4_ = 4;
      }
    }
    else {
      std::__cxx11::string::string((string *)&equal);
      local_a8 = std::__cxx11::string::find_first_of((char)local_68,0x3d);
      if (local_a8 != -1) {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)local_68);
        std::__cxx11::string::operator=((string *)&equal,local_c8);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::substr((ulong)&option,(ulong)local_68);
        std::__cxx11::string::operator=((string *)local_68,(string *)&option);
        std::__cxx11::string::~string((string *)&option);
      }
      __range2 = (vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_> *)0x0;
      __end2 = std::vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>::begin
                         (&this->options);
      o = (Option *)
          std::vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>::end
                    (&this->options);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<wasm::Options::Option_*,_std::vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>_>
                                         *)&o), bVar1) {
        __lhs = __gnu_cxx::
                __normal_iterator<wasm::Options::Option_*,_std::vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>_>
                ::operator*(&__end2);
        _Var2 = std::operator==(&__lhs->longName,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68);
        if ((!_Var2) &&
           (_Var2 = std::operator==(&__lhs->shortName,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68), !_Var2)) {
          __lhs = (reference)__range2;
        }
        __range2 = (vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_> *)__lhs;
        __gnu_cxx::
        __normal_iterator<wasm::Options::Option_*,_std::vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>_>
        ::operator++(&__end2);
      }
      if (__range2 == (vector<wasm::Options::Option,_std::allocator<wasm::Options::Option>_> *)0x0)
      {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
        poVar4 = std::operator<<(poVar4,(string *)local_68);
        std::operator<<(poVar4,"\'\n");
        exit(1);
      }
      switch(*(undefined4 *)
              &__range2[5].
               super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
               _M_impl.super__Vector_impl_data._M_finish) {
      case 0:
        lVar5 = std::__cxx11::string::size();
        if (lVar5 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Unexpected argument \'");
          poVar4 = std::operator<<(poVar4,(string *)&equal);
          poVar4 = std::operator<<(poVar4,"\' for option \'");
          poVar4 = std::operator<<(poVar4,(string *)local_68);
          std::operator<<(poVar4,"\'\n");
          exit(1);
        }
        break;
      case 1:
        if (__range2[7].
            super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Unexpected second argument \'");
          poVar4 = std::operator<<(poVar4,(string *)&equal);
          poVar4 = std::operator<<(poVar4,"\' for \'");
          poVar4 = std::operator<<(poVar4,(string *)local_68);
          std::operator<<(poVar4,"\'\n");
          exit(1);
        }
      case 2:
        lVar5 = std::__cxx11::string::size();
        if (lVar5 == 0) {
          if (e + 1 == currentOption.field_2._8_8_) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t find expected argument for \'"
                                    );
            poVar4 = std::operator<<(poVar4,(string *)local_68);
            std::operator<<(poVar4,"\'\n");
            exit(1);
          }
          std::__cxx11::string::operator=((string *)&equal,argv[e + 1]);
          e = e + 1;
        }
        break;
      case 3:
      }
      std::
      function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&__range2[5].
                       super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&equal);
      __range2[7].super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)&((__range2[7].
                       super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->longName).field_0x1;
      std::__cxx11::string::~string((string *)&equal);
      argument.field_2._8_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_68);
    e = e + 1;
  } while( true );
}

Assistant:

void Options::parse(int argc, const char* argv[]) {

// On Windows, get the wide char version of the command line flags, and convert
// each one to std::string with UTF-8 manually. This means that all paths in
// Binaryen are stored this way on all platforms right up until a library call
// is made to open a file (at which point we use Path::to_path to convert back)
// so that it works with the underlying Win32 APIs.
// Only argList (and not argv) should be used below.
#ifdef USE_WSTRING_PATHS
  LPWSTR* argListW = CommandLineToArgvW(GetCommandLineW(), &argc);
  std::vector<std::string> argList;
  for (size_t i = 0, e = argc; i < e; ++i) {
    argList.push_back(wasm::Path::wstring_to_string(argListW[i]));
  }
#else
  const char** argList = argv;
#endif

  assert(argc > 0 && "expect at least program name as an argument");
  size_t positionalsSeen = 0;
  auto dashes = [](const std::string& s) {
    for (size_t i = 0; i < s.size(); ++i) {
      if (s[i] != '-') {
        return i;
      }
    }
    return s.size();
  };
  for (size_t i = 1, e = argc; i != e; ++i) {
    std::string currentOption = argList[i];

    // "-" alone is a positional option
    if (dashes(currentOption) == 0 || currentOption == "-") {
      // Positional.
      switch (positional) {
        case Arguments::Zero:
          // Optional arguments must use --flag=A format, and not separated by
          // spaces (which would be ambiguous).
        case Arguments::Optional:
          std::cerr << "Unexpected positional argument '" << currentOption
                    << "'\n";
          exit(EXIT_FAILURE);
        case Arguments::One:
          if (positionalsSeen) {
            std::cerr << "Unexpected second positional argument '"
                      << currentOption << "' for " << positionalName << '\n';
            exit(EXIT_FAILURE);
          }
          [[fallthrough]];
        case Arguments::N:
          positionalAction(this, currentOption);
          ++positionalsSeen;
          break;
      }
      continue;
    }

    // Non-positional.
    std::string argument;
    auto equal = currentOption.find_first_of('=');
    if (equal != std::string::npos) {
      argument = currentOption.substr(equal + 1);
      currentOption = currentOption.substr(0, equal);
    }
    Option* option = nullptr;
    for (auto& o : options) {
      if (o.longName == currentOption || o.shortName == currentOption) {
        option = &o;
      }
    }
    if (!option) {
      std::cerr << "Unknown option '" << currentOption << "'\n";
      exit(EXIT_FAILURE);
    }
    switch (option->arguments) {
      case Arguments::Zero:
        if (argument.size()) {
          std::cerr << "Unexpected argument '" << argument << "' for option '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        break;
      case Arguments::One:
        if (option->seen) {
          std::cerr << "Unexpected second argument '" << argument << "' for '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        [[fallthrough]];
      case Arguments::N:
        if (!argument.size()) {
          if (i + 1 == e) {
            std::cerr << "Couldn't find expected argument for '"
                      << currentOption << "'\n";
            exit(EXIT_FAILURE);
          }
          argument = argList[++i];
        }
        break;
      case Arguments::Optional:
        break;
    }
    option->action(this, argument);
    ++option->seen;
  }
}